

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::cloneDragDropEvent
          (QGraphicsScenePrivate *this,QGraphicsSceneDragDropEvent *dest,
          QGraphicsSceneDragDropEvent *source)

{
  long lVar1;
  QGraphicsSceneEvent *in_RSI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff48;
  DropAction in_stack_ffffffffffffff4c;
  QGraphicsSceneEvent *this_00;
  QFlagsStorage<Qt::DropAction> actions;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RSI;
  QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9c7692);
  QGraphicsSceneEvent::setWidget
            (this_00,(QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  QGraphicsSceneDragDropEvent::pos((QGraphicsSceneDragDropEvent *)in_RSI);
  QGraphicsSceneDragDropEvent::setPos
            ((QGraphicsSceneDragDropEvent *)this_00,
             (QPointF *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  QGraphicsSceneDragDropEvent::scenePos((QGraphicsSceneDragDropEvent *)in_RSI);
  actions.i = (Int)((ulong)in_RSI >> 0x20);
  QGraphicsSceneDragDropEvent::setScenePos
            ((QGraphicsSceneDragDropEvent *)this_00,
             (QPointF *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  QGraphicsSceneDragDropEvent::screenPos((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setScreenPos
            ((QGraphicsSceneDragDropEvent *)this_00,
             (QPoint *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  QGraphicsSceneDragDropEvent::buttons((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setButtons
            ((QGraphicsSceneDragDropEvent *)this_00,(MouseButtons)actions.i);
  QGraphicsSceneDragDropEvent::modifiers((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setModifiers
            ((QGraphicsSceneDragDropEvent *)this_00,(KeyboardModifiers)actions.i);
  QGraphicsSceneDragDropEvent::possibleActions((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setPossibleActions
            ((QGraphicsSceneDragDropEvent *)this_00,(DropActions)actions.i);
  QGraphicsSceneDragDropEvent::proposedAction((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setProposedAction
            ((QGraphicsSceneDragDropEvent *)this_00,in_stack_ffffffffffffff4c);
  QGraphicsSceneDragDropEvent::dropAction((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setDropAction
            ((QGraphicsSceneDragDropEvent *)this_00,in_stack_ffffffffffffff4c);
  QGraphicsSceneDragDropEvent::source((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setSource
            ((QGraphicsSceneDragDropEvent *)this_00,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  QGraphicsSceneDragDropEvent::mimeData((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setMimeData
            ((QGraphicsSceneDragDropEvent *)this_00,
             (QMimeData *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::cloneDragDropEvent(QGraphicsSceneDragDropEvent *dest,
                                               QGraphicsSceneDragDropEvent *source)
{
    dest->setWidget(source->widget());
    dest->setPos(source->pos());
    dest->setScenePos(source->scenePos());
    dest->setScreenPos(source->screenPos());
    dest->setButtons(source->buttons());
    dest->setModifiers(source->modifiers());
    dest->setPossibleActions(source->possibleActions());
    dest->setProposedAction(source->proposedAction());
    dest->setDropAction(source->dropAction());
    dest->setSource(source->source());
    dest->setMimeData(source->mimeData());
}